

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yarn4.hpp
# Opt level: O3

void __thiscall trng::yarn4::backward(yarn4 *this)

{
  undefined1 auVar1 [16];
  int iVar2;
  int iVar3;
  uint uVar4;
  int32_t iVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  
  iVar6 = (this->P).a[3];
  if (iVar6 == 0) {
    iVar6 = (this->P).a[2];
    if (iVar6 != 0) {
      lVar7 = (long)(this->S).r[2] * (long)(this->P).a[0];
      auVar1 = SEXT816(lVar7) * ZEXT816(0x8000000100000003);
      iVar3 = (((int)(auVar1._8_8_ >> 0x1e) - (auVar1._12_4_ >> 0x1f)) * 0x7fffffff - (int)lVar7) +
              (this->S).r[1];
      iVar2 = iVar3 + 0x7fffffff;
      if (-1 < iVar3) {
        iVar2 = iVar3;
      }
      iVar3 = (this->P).a[1];
      goto LAB_00112c68;
    }
    iVar6 = (this->P).a[1];
    if (iVar6 != 0) {
      iVar2 = (this->S).r[2];
      lVar7 = (long)(this->S).r[3] * (long)(this->P).a[0];
      auVar1 = SEXT816(lVar7) * ZEXT816(0x8000000100000003);
      iVar3 = ((int)(auVar1._8_8_ >> 0x1e) - (auVar1._12_4_ >> 0x1f)) * 0x7fffffff - (int)lVar7;
      iVar8 = iVar2 + iVar3;
      iVar2 = iVar2 + iVar3 + 0x7fffffff;
      if (-1 < iVar8) {
        iVar2 = iVar8;
      }
      uVar10 = (ulong)iVar2;
      goto LAB_00112c9c;
    }
    iVar5 = (this->P).a[0];
    if (iVar5 == 0) {
      iVar6 = 0;
      goto LAB_00112cca;
    }
    iVar6 = (this->S).r[3];
    iVar5 = int_math::modulo_inverse(iVar5,0x7fffffff);
    lVar7 = (long)iVar5 * (long)iVar6;
    lVar9 = SUB168(SEXT816(lVar7) * SEXT816(-0x7ffffffefffffffd),8);
  }
  else {
    lVar7 = (long)(this->S).r[1] * (long)(this->P).a[0];
    auVar1 = SEXT816(lVar7) * ZEXT816(0x8000000100000003);
    iVar2 = (((int)(auVar1._8_8_ >> 0x1e) - (auVar1._12_4_ >> 0x1f)) * 0x7fffffff - (int)lVar7) +
            (this->S).r[0];
    iVar3 = iVar2 + 0x7fffffff;
    if (-1 < iVar2) {
      iVar3 = iVar2;
    }
    lVar7 = (long)(this->S).r[2] * (long)(this->P).a[1];
    auVar1 = SEXT816(lVar7) * ZEXT816(0x8000000100000003);
    iVar3 = (((int)(auVar1._8_8_ >> 0x1e) - (auVar1._12_4_ >> 0x1f)) * 0x7fffffff - (int)lVar7) +
            iVar3;
    iVar2 = iVar3 + 0x7fffffff;
    if (-1 < iVar3) {
      iVar2 = iVar3;
    }
    iVar3 = (this->P).a[2];
LAB_00112c68:
    lVar7 = (long)(this->S).r[3] * (long)iVar3;
    auVar1 = SEXT816(lVar7) * ZEXT816(0x8000000100000003);
    uVar4 = (((int)(auVar1._8_8_ >> 0x1e) - (auVar1._12_4_ >> 0x1f)) * 0x7fffffff - (int)lVar7) +
            iVar2;
    uVar10 = (ulong)(uVar4 + 0x7fffffff);
    if (-1 < (int)uVar4) {
      uVar10 = (ulong)uVar4;
    }
LAB_00112c9c:
    iVar5 = int_math::modulo_inverse(iVar6,0x7fffffff);
    lVar7 = (long)iVar5 * uVar10;
    lVar9 = SUB168(SEXT816(lVar7) * SEXT816(-0x7ffffffefffffffd),8);
  }
  iVar6 = (int)lVar7 +
          ((int)((ulong)(lVar9 + lVar7) >> 0x1e) - (int)(lVar9 + lVar7 >> 0x3f)) * -0x7fffffff;
LAB_00112cca:
  *(undefined8 *)(this->S).r = *(undefined8 *)((this->S).r + 1);
  (this->S).r[2] = (this->S).r[3];
  (this->S).r[3] = iVar6;
  return;
}

Assistant:

TRNG_CUDA_ENABLE
  inline void yarn4::backward() {
    result_type t;
    if (P.a[3] != 0) {
      t = S.r[0];
      t -= static_cast<result_type>(
          (static_cast<int64_t>(P.a[0]) * static_cast<int64_t>(S.r[1])) % modulus);
      if (t < 0)
        t += modulus;
      t -= static_cast<result_type>(
          (static_cast<int64_t>(P.a[1]) * static_cast<int64_t>(S.r[2])) % modulus);
      if (t < 0)
        t += modulus;
      t -= static_cast<result_type>(
          (static_cast<int64_t>(P.a[2]) * static_cast<int64_t>(S.r[3])) % modulus);
      if (t < 0)
        t += modulus;
      t = static_cast<result_type>(
          (static_cast<int64_t>(t) *
           static_cast<int64_t>(int_math::modulo_inverse(P.a[3], modulus))) %
          modulus);
    } else if (P.a[2] != 0) {
      t = S.r[1];
      t -= static_cast<result_type>(
          (static_cast<int64_t>(P.a[0]) * static_cast<int64_t>(S.r[2])) % modulus);
      if (t < 0)
        t += modulus;
      t -= static_cast<result_type>(
          (static_cast<int64_t>(P.a[1]) * static_cast<int64_t>(S.r[3])) % modulus);
      if (t < 0)
        t += modulus;
      t = static_cast<result_type>(
          (static_cast<int64_t>(t) *
           static_cast<int64_t>(int_math::modulo_inverse(P.a[2], modulus))) %
          modulus);
    } else if (P.a[1] != 0) {
      t = S.r[2];
      t -= static_cast<result_type>(
          (static_cast<int64_t>(P.a[0]) * static_cast<int64_t>(S.r[3])) % modulus);
      if (t < 0)
        t += modulus;
      t = static_cast<result_type>(
          (static_cast<int64_t>(t) *
           static_cast<int64_t>(int_math::modulo_inverse(P.a[1], modulus))) %
          modulus);
    } else if (P.a[0] != 0) {
      t = S.r[3];
      t = static_cast<result_type>(
          (static_cast<int64_t>(t) *
           static_cast<int64_t>(int_math::modulo_inverse(P.a[0], modulus))) %
          modulus);
    } else
      t = 0;
    S.r[0] = S.r[1];
    S.r[1] = S.r[2];
    S.r[2] = S.r[3];
    S.r[3] = t;
  }